

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

void helicsFederateSendCommand(HelicsFederate fed,char *target,char *command,HelicsError *err)

{
  long *plVar1;
  Federate *this;
  size_t sVar2;
  string_view target_00;
  string_view commandStr;
  long *local_70;
  size_t local_68;
  long local_60 [2];
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  this = getFed(fed,err);
  if (this != (Federate *)0x0) {
    local_50 = local_40;
    if (target == (char *)0x0) {
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
                 gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p +
                 gHelicsEmptyStr_abi_cxx11_._M_string_length);
    }
    else {
      sVar2 = strlen(target);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,target,target + sVar2);
    }
    plVar1 = local_50;
    local_70 = local_60;
    if (command == (char *)0x0) {
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
                 gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p +
                 gHelicsEmptyStr_abi_cxx11_._M_string_length);
    }
    else {
      sVar2 = strlen(command);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,command,command + sVar2);
    }
    target_00._M_str = (char *)plVar1;
    target_00._M_len = local_48;
    commandStr._M_str = (char *)local_70;
    commandStr._M_len = local_68;
    helics::Federate::sendCommand(this,target_00,commandStr,HELICS_SEQUENCING_MODE_FAST);
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  return;
}

Assistant:

void helicsFederateSendCommand(HelicsFederate fed, const char* target, const char* command, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    fedObj->sendCommand(AS_STRING(target), AS_STRING(command));
}